

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall Parser::parseUnaryOp(Parser *this)

{
  uint uVar1;
  Node *pNVar2;
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  sockaddr *__addr_04;
  sockaddr *__addr_05;
  sockaddr *__addr_06;
  Parser *in_RDI;
  Token *unaff_retaddr;
  Parser *in_stack_00000008;
  Token *opToken;
  Parser *in_stack_ffffffffffffffe8;
  Node *in_stack_fffffffffffffff8;
  
  uVar1 = accept(in_RDI,0xb,in_RDX,in_RCX);
  if (((((((uVar1 & 1) == 0) && (uVar1 = accept(in_RDI,10,__addr,in_RCX), (uVar1 & 1) == 0)) &&
        (uVar1 = accept(in_RDI,0xf,__addr_00,in_RCX), (uVar1 & 1) == 0)) &&
       ((uVar1 = accept(in_RDI,0xe,__addr_01,in_RCX), (uVar1 & 1) == 0 &&
        (uVar1 = accept(in_RDI,0x15,__addr_02,in_RCX), (uVar1 & 1) == 0)))) &&
      ((uVar1 = accept(in_RDI,0x16,__addr_03,in_RCX), (uVar1 & 1) == 0 &&
       ((uVar1 = accept(in_RDI,0x4a,__addr_04,in_RCX), (uVar1 & 1) == 0 &&
        (uVar1 = accept(in_RDI,0x3c,__addr_05,in_RCX), (uVar1 & 1) == 0)))))) &&
     (uVar1 = accept(in_RDI,0x47,__addr_06,in_RCX), (uVar1 & 1) == 0)) {
    pNVar2 = parseReaderMacro(in_stack_ffffffffffffffe8);
    return pNVar2;
  }
  parseUnaryOp((Parser *)in_RDI->tok);
  pNVar2 = createUnaryPreOpNode(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
  return pNVar2;
}

Assistant:

Node * parseUnaryOp()
  {
    if (accept(TK_MINUS) || accept(TK_PLUS) || accept(TK_INV) || accept(TK_NOT) || accept(TK_PLUSPLUS) || accept(TK_MINUSMINUS) ||
      accept(TK_TYPEOF) || accept(TK_DELETE) || accept(TK_CLONE))
    {
      Token & opToken = *tok;
      return createUnaryPreOpNode(opToken, parseUnaryOp());
    }
    else
    {
      return parseReaderMacro();
    }
  }